

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3length.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char local_5ff8 [8];
  char buf [256];
  adu_t *adu;
  unsigned_long_long time;
  undefined1 local_5ee0 [4];
  int ret;
  mp3_frame_t frame;
  aq_t qin;
  file_t mp3file;
  int retval;
  char **argv_local;
  int argc_local;
  
  mp3file.pos._4_4_ = 0;
  if (argc == 2) {
    iVar1 = file_open_read((file_t *)&qin.size,argv[1]);
    if (iVar1 == 0) {
      fprintf(_stderr,"Could not open mp3 file: %s\n",argv[1]);
      mp3file.pos._4_4_ = 1;
    }
    else {
      aq_init((aq_t *)(frame.raw + 0xf98));
      adu = (adu_t *)0x0;
      while (iVar1 = mp3_next_frame((file_t *)&qin.size,(mp3_frame_t *)local_5ee0), 0 < iVar1) {
        iVar1 = aq_add_frame((aq_t *)(frame.raw + 0xf98),(mp3_frame_t *)local_5ee0);
        if (iVar1 != 0) {
          buf._248_8_ = aq_get_adu((aq_t *)(frame.raw + 0xf98));
          if ((adu_t *)buf._248_8_ == (adu_t *)0x0) {
            __assert_fail("adu != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3length.c"
                          ,0x2a,"int main(int, char **)");
          }
          adu = (adu_t *)(adu->crc + (((adu_t *)buf._248_8_)->usec - 0xc));
          free((void *)buf._248_8_);
        }
      }
      file_close((file_t *)&qin.size);
      aq_destroy((aq_t *)(frame.raw + 0xf98));
      format_time((ulong)adu / 1000,local_5ff8,0x100);
      printf("Length of %s: %s\n",argv[1],local_5ff8);
    }
    argv_local._4_4_ = mp3file.pos._4_4_;
  }
  else {
    usage();
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  int retval = EXIT_SUCCESS;

  if (argc != 2) {
    usage();
    return EXIT_FAILURE;
  }

  file_t mp3file;
  if (!file_open_read(&mp3file, argv[1])) {
    fprintf(stderr, "Could not open mp3 file: %s\n", argv[1]);
    retval = EXIT_FAILURE;
    goto exit;
  }

  aq_t qin;
  aq_init(&qin);
  
  mp3_frame_t frame;
  int ret;
  unsigned long long time = 0;
  while ((ret = mp3_next_frame(&mp3file, &frame)) > 0) {
    if (aq_add_frame(&qin, &frame)) { 
      adu_t *adu = aq_get_adu(&qin);
      assert(adu != NULL);
      
      time += adu->usec;
      free(adu);
    }
  }
          
  file_close(&mp3file);
  aq_destroy(&qin);

  char buf[256];
  format_time(time / 1000, buf, sizeof(buf));
  printf("Length of %s: %s\n", argv[1], buf);

 exit:
  return retval;
}